

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_heap.cpp
# Opt level: O3

string_t __thiscall duckdb::StringHeap::EmptyString(StringHeap *this,idx_t len)

{
  data_ptr_t __src;
  OutOfRangeException *this_00;
  string_t sVar1;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  string local_40;
  
  if (len >> 0x20 == 0) {
    __src = ArenaAllocator::Allocate(&this->allocator,len);
    if (len < 0xd) {
      local_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (len == 0) {
        __src = (data_ptr_t)0x0;
      }
      else {
        switchD_015de399::default(&uStack_4c,__src,len);
        __src = (data_ptr_t)CONCAT44(local_44,uStack_48);
      }
    }
    else {
      uStack_4c = *(undefined4 *)__src;
    }
    sVar1.value._4_1_ = (undefined1)uStack_4c;
    sVar1.value._5_1_ = uStack_4c._1_1_;
    sVar1.value._6_1_ = uStack_4c._2_1_;
    sVar1.value._7_1_ = uStack_4c._3_1_;
    sVar1.value.pointer.length = (int)len;
    sVar1.value.pointer.ptr = (char *)__src;
    return (string_t)sVar1.value;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Cannot create a string of size: \'%d\', the maximum supported string size is: \'%d\'",
             "");
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long>
            (this_00,&local_40,len,0xffffffff);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string_t StringHeap::EmptyString(idx_t len) {
	D_ASSERT(len > string_t::INLINE_LENGTH);
	if (len > string_t::MAX_STRING_SIZE) {
		throw OutOfRangeException("Cannot create a string of size: '%d', the maximum supported string size is: '%d'",
		                          len, string_t::MAX_STRING_SIZE);
	}
	auto insert_pos = const_char_ptr_cast(allocator.Allocate(len));
	return string_t(insert_pos, UnsafeNumericCast<uint32_t>(len));
}